

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall
luna::Exception::SetWhat<char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char *args,char **args_1,char (*args_2) [7]
          ,char **args_3)

{
  char *__s;
  undefined8 in_RAX;
  size_t sVar1;
  undefined8 uStack_38;
  
  __s = *arg;
  uStack_38 = in_RAX;
  if (__s == (char *)0x0) {
    std::ios::clear((int)oss + (int)*(undefined8 *)(*(long *)oss + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,__s,sVar1);
  }
  uStack_38 = CONCAT17(*args,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)oss,(char *)((long)&uStack_38 + 7),1);
  SetWhat<char_const*,char_const(&)[7],char_const*>(this,oss,args_1,args_2,args_3);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }